

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  TestEnum_9c8e9318b29d9cd3 TVar1;
  bool bVar2;
  uint16_t uVar3;
  TestEnum_9c8e9318b29d9cd3 TVar4;
  int iVar5;
  int iVar6;
  Reader *this_00;
  TestEnum_9c8e9318b29d9cd3 *pTVar7;
  uint index;
  bool bVar8;
  long lVar9;
  BuilderFor<DynamicEnum> BVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Type expected;
  initializer_list<capnp::DynamicValue::Reader> value;
  Fault f;
  Builder root;
  BuilderFor<capnp::DynamicList> list;
  MallocMessageBuilder builder;
  ListElementCount local_278;
  TestEnum_9c8e9318b29d9cd3 local_274 [2];
  DynamicEnum local_270;
  anon_union_8_2_eba6ea51_for_Type_5 local_260;
  Reader local_258;
  Reader local_210;
  Builder local_1c8;
  BuilderFor<DynamicList> local_198;
  Builder local_160;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_258,&local_120.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1c8,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  local_258.type._0_2_ = ENUM;
  local_258.type._2_2_ = UNKNOWN >> 0x10;
  local_258.field_1.floatValue = (double)((long)schemas::s_9c8e9318b29d9cd3 + 0x48);
  local_258.field_1.enumValue.value = 2;
  name_02.content.size_ = 10;
  name_02.content.ptr = "enumField";
  DynamicStruct::Builder::set(&local_1c8,name_02,&local_258);
  DynamicValue::Reader::~Reader(&local_258);
  local_258.type._0_2_ = 9;
  local_258.type._2_2_ = UNKNOWN >> 0x10;
  local_258.field_1.floatValue = (double)((long)schemas::s_9c8e9318b29d9cd3 + 0x48);
  local_258.field_1.enumValue.value = 1;
  local_210.type = ENUM;
  local_210.field_1.floatValue = 3.14717444885774e-317;
  local_210.field_1.enumValue.value = 0;
  name_03.content.size_ = 9;
  name_03.content.ptr = "enumList";
  value._M_len = 2;
  value._M_array = &local_258;
  DynamicStruct::Builder::set(&local_1c8,name_03,value);
  this_00 = &local_210;
  lVar9 = 0;
  do {
    DynamicValue::Reader::~Reader(this_00);
    lVar9 = lVar9 + 0x48;
    this_00 = this_00 + -1;
  } while (lVar9 != 0x90);
  name.content.size_ = 10;
  name.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&local_258,&local_1c8,name);
  BVar10 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                     ((Builder *)&local_258);
  local_198.schema.elementType._0_8_ = BVar10.schema.super_Schema.raw;
  local_198.schema.elementType.field_4.scopeId._0_2_ = BVar10.value;
  uVar3 = DynamicEnum::asImpl((DynamicEnum *)&local_198,0x9c8e9318b29d9cd3);
  DynamicValue::Builder::~Builder((Builder *)&local_258);
  if ((uVar3 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_270.schema.super_Schema.raw._0_2_ = 2;
    name_00.content.size_ = 10;
    name_00.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&local_258,&local_1c8,name_00);
    BVar10 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Builder *)&local_258);
    local_198.schema.elementType._0_8_ = BVar10.schema.super_Schema.raw;
    local_198.schema.elementType.field_4.scopeId._0_2_ = BVar10.value;
    uVar3 = DynamicEnum::asImpl((DynamicEnum *)&local_198,0x9c8e9318b29d9cd3);
    local_278 = CONCAT22(local_278._2_2_,uVar3);
    kj::_::Debug::
    log<char_const(&)[75],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
               ,(char (*) [75])
                "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
               (TestEnum_9c8e9318b29d9cd3 *)&local_270,(TestEnum_9c8e9318b29d9cd3 *)&local_278);
    DynamicValue::Builder::~Builder((Builder *)&local_258);
  }
  name_01.content.size_ = 9;
  name_01.content.ptr = "enumList";
  DynamicStruct::Builder::get(&local_160,&local_1c8,name_01);
  local_274[0] = BAR;
  local_274[1] = FOO;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_198,&local_160);
  if (local_198.builder.elementCount != 2) {
    local_270.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x2;
    local_278 = local_198.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              ((Fault *)&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x23,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               (unsigned_long *)&local_270,&local_278);
    kj::_::Debug::Fault::fatal((Fault *)&local_258);
  }
  local_260.schema = (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  index = 0;
  pTVar7 = local_274;
  bVar2 = true;
  do {
    bVar8 = bVar2;
    TVar1 = *pTVar7;
    DynamicList::Builder::operator[]((Builder *)&local_258,&local_198,index);
    BVar10 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Builder *)&local_258);
    local_270.schema = BVar10.schema.super_Schema.raw;
    local_270.value = BVar10.value;
    TVar4 = DynamicEnum::asImpl(&local_270,0x9c8e9318b29d9cd3);
    DynamicValue::Builder::~Builder((Builder *)&local_258);
    if ((TVar1 != TVar4) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&local_258,&local_198,index);
      BVar10 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                         ((Builder *)&local_258);
      local_270.schema = BVar10.schema.super_Schema.raw;
      local_270.value = BVar10.value;
      uVar3 = DynamicEnum::asImpl(&local_270,0x9c8e9318b29d9cd3);
      local_278 = CONCAT22(local_278._2_2_,uVar3);
      kj::_::Debug::
      log<char_const(&)[75],capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(expected.begin()[i]) == (list[i].template as<Element>())\", expected.begin()[i], list[i].template as<Element>()"
                 ,(char (*) [75])
                  "failed: expected (expected.begin()[i]) == (list[i].template as<Element>())",
                 pTVar7,(TestEnum_9c8e9318b29d9cd3 *)&local_278);
      DynamicValue::Builder::~Builder((Builder *)&local_258);
    }
    index = 1;
    pTVar7 = local_274 + 1;
    bVar2 = false;
  } while (bVar8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_258,&local_160);
  expected.field_4.schema = local_260.schema;
  expected.baseType = ENUM;
  expected.listDepth = '\0';
  expected.isImplicitParam = false;
  expected.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  expected._6_2_ = 0;
  Type::requireUsableAs((Type *)&local_258,expected);
  if (local_258.field_1._32_4_ == 2) {
    iVar6 = 0;
    pTVar7 = local_274;
    iVar5 = kj::_::Debug::minSeverity;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      TVar1 = *(TestEnum_9c8e9318b29d9cd3 *)
               ((long)&(local_258.field_1.listValue.reader.capTable)->_vptr_CapTableReader +
               (ulong)((uint)(iVar6 * local_258.field_1._36_4_) >> 3));
      if ((*pTVar7 != TVar1) && (iVar5 < 3)) {
        local_258.type._0_2_ = TVar1;
        kj::_::Debug::
        log<char_const(&)[53],capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x2b,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (typed[i])\", expected.begin()[i], typed[i]"
                   ,(char (*) [53])"failed: expected (expected.begin()[i]) == (typed[i])",pTVar7,
                   (TestEnum_9c8e9318b29d9cd3 *)&local_258);
        iVar5 = kj::_::Debug::minSeverity;
      }
      iVar6 = 1;
      pTVar7 = local_274 + 1;
      bVar2 = false;
    } while (bVar8);
    DynamicValue::Builder::~Builder(&local_160);
    MallocMessageBuilder::~MallocMessageBuilder(&local_120);
    return;
  }
  local_270.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x2;
  local_278 = local_258.field_1._32_4_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            ((Fault *)&local_258,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x29,FAILED,"(expected.size()) == (typed.size())","expected.size(), typed.size()",
             (unsigned_long *)&local_270,&local_278);
  kj::_::Debug::Fault::fatal((Fault *)&local_258);
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}